

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t icu_63::MessagePattern::parseArgNumber(UnicodeString *s,int32_t start,int32_t limit)

{
  short sVar1;
  char16_t cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char16_t *pcVar8;
  
  if (limit <= start) {
    return -2;
  }
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = *(uint *)((long)&s->fUnion + 4);
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (uVar5 <= (uint)start) {
    return -1;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar8 = (s->fUnion).fFields.fArray;
  }
  else {
    pcVar8 = (char16_t *)((long)&s->fUnion + 2);
  }
  uVar7 = start + 1;
  cVar2 = pcVar8[start];
  if ((ushort)cVar2 == 0x30) {
    bVar3 = true;
    iVar4 = 0;
    if (uVar7 == limit) {
      return 0;
    }
  }
  else {
    if (8 < (ushort)(cVar2 + L'ￏ')) {
      return -1;
    }
    iVar4 = (ushort)cVar2 - 0x30;
    bVar3 = false;
  }
  if ((int)uVar7 < limit) {
    pcVar8 = pcVar8 + (int)uVar7;
    do {
      if (uVar5 <= uVar7) {
        return -1;
      }
      if (9 < (ushort)(*pcVar8 + L'￐')) {
        return -1;
      }
      if (0xccccccb < iVar4) {
        bVar3 = true;
      }
      iVar4 = (uint)(ushort)*pcVar8 + iVar4 * 10 + -0x30;
      uVar7 = uVar7 + 1;
      pcVar8 = pcVar8 + 1;
    } while (limit != uVar7);
  }
  iVar6 = -2;
  if (!bVar3) {
    iVar6 = iVar4;
  }
  return iVar6;
}

Assistant:

int32_t
MessagePattern::parseArgNumber(const UnicodeString &s, int32_t start, int32_t limit) {
    // If the identifier contains only ASCII digits, then it is an argument _number_
    // and must not have leading zeros (except "0" itself).
    // Otherwise it is an argument _name_.
    if(start>=limit) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    int32_t number;
    // Defer numeric errors until we know there are only digits.
    UBool badNumber;
    UChar c=s.charAt(start++);
    if(c==0x30) {
        if(start==limit) {
            return 0;
        } else {
            number=0;
            badNumber=TRUE;  // leading zero
        }
    } else if(0x31<=c && c<=0x39) {
        number=c-0x30;
        badNumber=FALSE;
    } else {
        return UMSGPAT_ARG_NAME_NOT_NUMBER;
    }
    while(start<limit) {
        c=s.charAt(start++);
        if(0x30<=c && c<=0x39) {
            if(number>=INT32_MAX/10) {
                badNumber=TRUE;  // overflow
            }
            number=number*10+(c-0x30);
        } else {
            return UMSGPAT_ARG_NAME_NOT_NUMBER;
        }
    }
    // There are only ASCII digits.
    if(badNumber) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    } else {
        return number;
    }
}